

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSDDOMParser::XSDDOMParser
          (XSDDOMParser *this,XMLValidator *valToAdopt,MemoryManager *manager,
          XMLGrammarPool *gramPool)

{
  int iVar1;
  undefined4 extraout_var;
  ValueVectorOf<unsigned_int> *pVVar2;
  undefined4 extraout_var_00;
  
  XercesDOMParser::XercesDOMParser(&this->super_XercesDOMParser,valToAdopt,manager,gramPool);
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
  _vptr_XMLDocumentHandler = (_func_int **)&PTR__XSDDOMParser_0041c4a0;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLErrorReporter.
  _vptr_XMLErrorReporter = (_func_int **)&DAT_0041c630;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLEntityHandler.
  _vptr_XMLEntityHandler = (_func_int **)&PTR__XSDDOMParser_0041c660;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_DocTypeHandler._vptr_DocTypeHandler =
       (_func_int **)&PTR__XSDDOMParser_0041c6a8;
  (this->super_XercesDOMParser).super_AbstractDOMParser.super_PSVIHandler._vptr_PSVIHandler =
       (_func_int **)&PTR__XSDDOMParser_0041c748;
  this->fSawFatal = false;
  this->fAnnotationDepth = -1;
  this->fInnerAnnotationDepth = -1;
  this->fDepth = -1;
  this->fUserErrorReporter = (XMLErrorReporter *)0x0;
  this->fUserEntityHandler = (XMLEntityHandler *)0x0;
  this->fURIs = (ValueVectorOf<unsigned_int> *)0x0;
  (this->fAnnotationBuf).fIndex = 0;
  (this->fAnnotationBuf).fCapacity = 0x3ff;
  (this->fAnnotationBuf).fFullSize = 0;
  (this->fAnnotationBuf).fUsed = false;
  (this->fAnnotationBuf).fMemoryManager = manager;
  (this->fAnnotationBuf).fFullHandler = (XMLBufferFullHandler *)0x0;
  (this->fAnnotationBuf).fBuffer = (XMLCh *)0x0;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager);
  (this->fAnnotationBuf).fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar1);
  *(XMLCh *)CONCAT44(extraout_var,iVar1) = L'\0';
  XSDErrorReporter::XSDErrorReporter(&this->fXSDErrorReporter,(XMLErrorReporter *)0x0);
  XSDLocator::XSDLocator(&this->fXSLocator);
  pVVar2 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,manager);
  pVVar2->fCallDestructor = false;
  pVVar2->fCurCount = 0;
  pVVar2->fMaxCount = 0x10;
  pVVar2->fElemList = (uint *)0x0;
  pVVar2->fMemoryManager = manager;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager);
  pVVar2->fElemList = (uint *)CONCAT44(extraout_var_00,iVar1);
  memset((uint *)CONCAT44(extraout_var_00,iVar1),0,pVVar2->fMaxCount << 2);
  this->fURIs = pVVar2;
  (this->fXSDErrorReporter).fErrorReporter =
       &(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLErrorReporter;
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)this,Val_Never);
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)this,true);
  return;
}

Assistant:

XSDDOMParser::XSDDOMParser( XMLValidator* const   valToAdopt
                          , MemoryManager* const  manager
                          , XMLGrammarPool* const gramPool):
    XercesDOMParser(valToAdopt, manager, gramPool)
    , fSawFatal(false)
    , fAnnotationDepth(-1)
    , fInnerAnnotationDepth(-1)
    , fDepth(-1)
    , fUserErrorReporter(0)
    , fUserEntityHandler(0)
    , fURIs(0)
    , fAnnotationBuf(1023, manager)

{
    fURIs = new (manager) ValueVectorOf<unsigned int>(16, manager);
    fXSDErrorReporter.setErrorReporter(this);
    setValidationScheme(XercesDOMParser::Val_Never);
    setDoNamespaces(true);
}